

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O2

char * decode_pure(int *digits_values,uint digits_size,char *s,uint s_size,int *result)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  
  pcVar5 = "invalid number literal.";
  bVar3 = false;
  bVar2 = false;
  iVar8 = 0;
  for (uVar7 = 0; s_size != uVar7; uVar7 = uVar7 + 1) {
    cVar1 = s[uVar7];
    iVar6 = 0;
    if ((long)cVar1 < 0) goto LAB_00122d8e;
    if (cVar1 == '-') {
      bVar3 = true;
      bVar4 = true;
      if (bVar2) goto LAB_00122d8e;
    }
    else if (cVar1 == ' ') {
      uVar9 = 1;
      if (bVar2) {
        uVar9 = digits_size;
      }
      iVar8 = iVar8 * uVar9;
      bVar4 = bVar2;
    }
    else {
      uVar9 = digits_values[cVar1];
      if (((int)uVar9 < 0) || (digits_size <= uVar9)) goto LAB_00122d8e;
      iVar8 = iVar8 * digits_size + uVar9;
      bVar4 = true;
    }
    bVar2 = bVar4;
  }
  iVar6 = -iVar8;
  if (!bVar3) {
    iVar6 = iVar8;
  }
  pcVar5 = (char *)0x0;
LAB_00122d8e:
  *result = iVar6;
  return pcVar5;
}

Assistant:

static
const char*
decode_pure(
  const int* digits_values,
  unsigned digits_size,
  const char* s,
  unsigned s_size,
  int* result)
{
  int si, dv;
  int have_minus = 0;
  int have_non_blank = 0;
  int value = 0;
  unsigned i = 0;
  for(;i<s_size;i++) {
    si = s[i];
    if (si < 0 || si > 127) {
      *result = 0;
      return invalid_number_literal();
    }
    if (si == ' ') {
      if (!have_non_blank) continue;
      value *= digits_size;
    }
    else if (si == '-') {
      if (have_non_blank) {
        *result = 0;
        return invalid_number_literal();
      }
      have_non_blank = 1;
      have_minus = 1;
      continue;
    }
    else {
      have_non_blank = 1;
      dv = digits_values[si];
      if (dv < 0 || dv >= digits_size) {
        *result = 0;
        return invalid_number_literal();
      }
      value *= digits_size;
      value += dv;
    }
  }
  if (have_minus) value = -value;
  *result = value;
  return 0;
}